

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O3

void aa_ret_free(aa_ret_object object)

{
  sarimax_wrapper_object __ptr;
  
  __ptr = (&object->Arima)[object->otype == 1];
  free(__ptr->sarimax);
  free(__ptr);
  free(object);
  return;
}

Assistant:

void aa_ret_free(aa_ret_object object) {
	// use proper free wrapers for given type 
	if (object->otype == 1) {
		myarima_free(object->myarima);
	} else {
		sarimax_wrapper_free(object->Arima);
	}
	free(object);
}